

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

prf_node_t * prf_node_clone(prf_node_t *node,prf_model_t *source,prf_model_t *target)

{
  byte *pbVar1;
  pool_t pool_id;
  ushort uVar2;
  uint16_t uVar3;
  prf_nodeinfo_t *ppVar4;
  prf_node_t *ppVar5;
  uint8_t *puVar6;
  
  ppVar4 = prf_nodeinfo_get(node->opcode);
  if ((ppVar4 != (prf_nodeinfo_t *)0x0) &&
     (ppVar4->clone_f != (_func_prf_node_t_ptr_prf_node_t_ptr_prf_model_t_ptr_prf_model_t_ptr *)0x0)
     ) {
    ppVar5 = (*ppVar4->clone_f)(node,source,target);
    return ppVar5;
  }
  if (target->mempool_id == 0) {
    ppVar5 = (prf_node_t *)malloc(0x28);
  }
  else {
    ppVar5 = (prf_node_t *)pool_malloc(target->mempool_id,0x28);
  }
  if (ppVar5 == (prf_node_t *)0x0) {
    prf_error(9,"memory allocation failure (returned NULL)");
    return (prf_node_t *)0x0;
  }
  ppVar5->opcode = 0;
  ppVar5->length = 4;
  *(undefined8 *)&ppVar5->flags = 0;
  *(undefined8 *)((long)&ppVar5->data + 4) = 0;
  *(undefined8 *)((long)&ppVar5->children + 4) = 0;
  *(undefined8 *)((long)&ppVar5->parent + 4) = 0;
  *(undefined4 *)((long)&ppVar5->userdata + 4) = 0;
  uVar3 = node->length;
  ppVar5->opcode = node->opcode;
  ppVar5->length = uVar3;
  pool_id = target->mempool_id;
  if (pool_id != 0) {
    pbVar1 = (byte *)((long)&ppVar5->flags + 1);
    *pbVar1 = *pbVar1 | 1;
  }
  uVar2 = node->length;
  if (uVar2 < 5 || pool_id != 0) {
    if (uVar2 < 5) goto LAB_00106997;
    puVar6 = (uint8_t *)pool_malloc(pool_id,uVar2 - 4);
  }
  else {
    puVar6 = (uint8_t *)malloc((ulong)(uVar2 - 4));
  }
  ppVar5->data = puVar6;
LAB_00106997:
  if (((ulong)node->length < 5) || (ppVar5->data != (uint8_t *)0x0)) {
    memcpy(ppVar5->data,node->data,(ulong)node->length - 4);
  }
  else {
    prf_error(9,"memory allocation failure (returned NULL)");
    if (target->mempool_id == 0) {
      free(ppVar5);
    }
    ppVar5 = (prf_node_t *)0x0;
  }
  return ppVar5;
}

Assistant:

prf_node_t *
prf_node_clone(
    prf_node_t * node,
    prf_model_t * source,
    prf_model_t * target )
{
    prf_nodeinfo_t * info;

    assert( node != NULL && target != NULL );

    info = prf_nodeinfo_get( node->opcode );
    if ( info != NULL && info->clone_f != NULL ) {
        return (*(info->clone_f))( node, source, target );
    } else {
        prf_node_t * newnode;
        if ( target->mempool_id == 0 ) {
            newnode = prf_node_create();
        } else {
            newnode = (prf_node_t *)pool_malloc( target->mempool_id, 
						 sizeof( prf_node_t ) );
            prf_node_clear( newnode );
        }
        if ( newnode == NULL ) {
            prf_error( 9, "memory allocation failure (returned NULL)" );
            return NULL;
        }
        newnode->opcode = node->opcode;
        newnode->length = node->length;
        if ( target->mempool_id != 0 )
            newnode->flags |= PRF_NODE_MEMPOOLED;
        if ( (node->length > 4) && (target->mempool_id == 0) )
            newnode->data = (uint8_t *)malloc( node->length - 4 );
        else if ( node->length > 4 )
            newnode->data = (uint8_t *)pool_malloc( target->mempool_id, 
						    node->length - 4 );
        if ( (node->length > 4) && (newnode->data == NULL) ) {
            prf_error( 9, "memory allocation failure (returned NULL)" );
            if ( target->mempool_id == 0 )
                free( newnode );
            return NULL;
        }
        memcpy( newnode->data, node->data, node->length - 4 );
        return newnode;
    }
}